

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

re_status_t __thiscall
CRegexParser::compile
          (CRegexParser *this,char *expr_str,size_t exprlen,re_compiled_pattern_base *pat)

{
  re_recog_type rVar1;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t ch2;
  int var_id;
  int min_val;
  int iVar5;
  CRegexParser *pCVar6;
  CRegexParser *pCVar7;
  uint uVar8;
  int shortest;
  re_machine *dest;
  uint uVar9;
  utf8_ptr local_350;
  size_t exprchars;
  re_machine new_machine;
  re_machine alter_machine;
  re_machine cur_machine;
  re_machine closure_machine;
  anon_struct_36_7_ed371931 group_stack [20];
  
  reset(this);
  pat->group_cnt = 0;
  pat->loop_var_cnt = 0;
  exprchars = utf8_ptr::s_len(expr_str,exprlen);
  pat->field_0x14 = pat->field_0x14 & 0xf0 | 0xd;
  cur_machine.init = -1;
  cur_machine.final = -1;
  alter_machine.init = -1;
  alter_machine.final = -1;
  var_id = 0;
  local_350.p_ = expr_str;
LAB_0029d945:
  if (exprchars == 0) goto LAB_0029e165;
  wVar3 = utf8_ptr::s_getch(local_350.p_);
  switch(wVar3) {
  case L'$':
    if (((exprchars < 2) || (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 == L')')) ||
       (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 == L'|')) {
      rVar1 = RE_TEXT_END;
      goto LAB_0029d9e9;
    }
    break;
  case L'%':
    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
    exprchars = exprchars - 1;
    if (exprchars == 0) {
      local_350.p_ = utf8_ptr::s_dec(local_350.p_);
      exprchars = exprchars + 1;
      goto LAB_0029e4a5;
    }
    wVar3 = utf8_ptr::s_getch(local_350.p_);
    switch(wVar3) {
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
      wVar3 = utf8_ptr::s_getch(local_350.p_);
      build_group_matcher(this,&new_machine,wVar3 + L'\xffffffcf');
      goto LAB_0029e239;
    case L':':
    case L';':
    case L'=':
    case L'?':
    case L'@':
    case L'A':
    case L'C':
    case L'E':
    case L'F':
    case L'G':
    case L'H':
    case L'I':
    case L'J':
    case L'K':
    case L'L':
    case L'M':
    case L'N':
    case L'O':
    case L'P':
    case L'Q':
    case L'R':
    case L'T':
    case L'U':
      goto switchD_0029d96c_caseD_26;
    case L'<':
      rVar1 = RE_WORD_BEGIN;
      goto LAB_0029d9e9;
    case L'>':
      rVar1 = RE_WORD_END;
      goto LAB_0029d9e9;
    case L'B':
      rVar1 = RE_NON_WORD_BOUNDARY;
LAB_0029d9e9:
      build_special(this,&new_machine,rVar1,L'\0');
      goto LAB_0029e49b;
    case L'D':
      rVar1 = RE_NON_DIGIT;
      break;
    case L'S':
      rVar1 = RE_NON_SPACE;
      break;
    case L'V':
      rVar1 = RE_NON_VSPACE;
      break;
    case L'W':
      rVar1 = RE_NON_WORD_CHAR;
      break;
    default:
      if (wVar3 == L'b') {
        rVar1 = RE_WORD_BOUNDARY;
        goto LAB_0029d9e9;
      }
      if (wVar3 == L'd') {
        rVar1 = RE_DIGIT;
      }
      else if (wVar3 == L's') {
        rVar1 = RE_SPACE;
      }
      else if (wVar3 == L'v') {
        rVar1 = RE_VSPACE;
      }
      else {
        if (wVar3 != L'w') goto switchD_0029d96c_caseD_26;
        rVar1 = RE_WORD_CHAR;
      }
    }
LAB_0029db52:
    build_special(this,&new_machine,rVar1,L'\0');
    goto LAB_0029e239;
  case L'&':
  case L'\'':
  case L'*':
  case L'+':
  case L',':
  case L'-':
    break;
  case L'(':
    goto switchD_0029d96c_caseD_28;
  case L')':
    if (var_id != 0) goto LAB_0029e172;
    var_id = 0;
    goto LAB_0029e4a5;
  case L'.':
    rVar1 = RE_WILDCARD;
    goto LAB_0029db52;
  default:
    if (wVar3 == L'<') {
      if (3 < exprchars) {
        iVar5 = memicmp(local_350.p_,"<FE>",4);
        if ((iVar5 == 0) ||
           ((9 < exprchars && (iVar5 = memicmp(local_350.p_,"<FirstEnd>",10), iVar5 == 0)))) {
          bVar2 = pat->field_0x14 & 0xf7;
          goto LAB_0029df9d;
        }
        if (3 < exprchars) {
          iVar5 = memicmp(local_350.p_,"<FB>",4);
          if ((iVar5 == 0) ||
             ((0xb < exprchars && (iVar5 = memicmp(local_350.p_,"<FirstBegin>",0xc), iVar5 == 0))))
          {
            bVar2 = pat->field_0x14 | 8;
            goto LAB_0029df9d;
          }
          if (4 < exprchars) {
            iVar5 = memicmp(local_350.p_,"<Max>",5);
            if (iVar5 == 0) {
              bVar2 = pat->field_0x14 | 4;
              goto LAB_0029df9d;
            }
            if (4 < exprchars) {
              iVar5 = memicmp(local_350.p_,"<Min>",5);
              if (iVar5 == 0) {
                bVar2 = pat->field_0x14 & 0xfb;
                goto LAB_0029df9d;
              }
              if (5 < exprchars) {
                iVar5 = memicmp(local_350.p_,"<Case>",6);
                if (iVar5 == 0) {
                  bVar2 = pat->field_0x14 | 3;
LAB_0029df9d:
                  pat->field_0x14 = bVar2;
                  do {
                    if (exprchars == 0) goto LAB_0029e4a5;
                    wVar3 = utf8_ptr::s_getch(local_350.p_);
                    if (wVar3 == L'>') goto LAB_0029e4a5;
                    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
                    exprchars = exprchars - 1;
                  } while( true );
                }
                if ((7 < exprchars) && (iVar5 = memicmp(local_350.p_,"<NoCase>",8), iVar5 == 0)) {
                  bVar2 = pat->field_0x14 & 0xfc | 2;
                  goto LAB_0029df9d;
                }
              }
            }
          }
        }
      }
      iVar5 = compile_char_class_expr(this,&local_350,&exprchars,&new_machine);
      if (iVar5 != 0) goto LAB_0029e239;
    }
    else {
      if (wVar3 == L'[') {
        this->range_buf_cnt_ = 0;
        local_350.p_ = utf8_ptr::s_inc(local_350.p_);
        exprchars = exprchars - 1;
        if (exprchars == 0) {
          uVar8 = 0;
        }
        else {
          wVar3 = utf8_ptr::s_getch(local_350.p_);
          if (wVar3 == L'^') {
            local_350.p_ = utf8_ptr::s_inc(local_350.p_);
            exprchars = exprchars - 1;
          }
          uVar8 = (uint)(wVar3 == L'^');
          if (exprchars != 0) {
            wVar3 = utf8_ptr::s_getch(local_350.p_);
            if (wVar3 == L']') {
              add_range_char(this,L']');
              local_350.p_ = utf8_ptr::s_inc(local_350.p_);
              exprchars = exprchars - 1;
            }
            if ((exprchars != 0) && (wVar3 = utf8_ptr::s_getch(local_350.p_), wVar3 == L'-')) {
              add_range_char(this,L'-');
              local_350.p_ = utf8_ptr::s_inc(local_350.p_);
              exprchars = exprchars - 1;
            }
          }
        }
        while ((exprchars != 0 && (wVar3 = utf8_ptr::s_getch(local_350.p_), wVar3 != L']'))) {
          wVar3 = utf8_ptr::s_getch(local_350.p_);
          local_350.p_ = utf8_ptr::s_inc(local_350.p_);
          exprchars = exprchars - 1;
          if ((exprchars == 0) || (wVar4 = utf8_ptr::s_getch(local_350.p_), wVar4 != L'-')) {
            add_range_char(this,wVar3);
          }
          else {
            local_350.p_ = utf8_ptr::s_inc(local_350.p_);
            exprchars = exprchars - 1;
            if (exprchars != 0) {
              ch2 = utf8_ptr::s_getch(local_350.p_);
              local_350.p_ = utf8_ptr::s_inc(local_350.p_);
              exprchars = exprchars - 1;
              wVar4 = ch2;
              if (wVar3 < ch2) {
                wVar4 = wVar3;
              }
              if (ch2 < wVar3) {
                ch2 = wVar3;
              }
              add_range_char(this,wVar4,ch2);
            }
          }
        }
        build_char_range(this,&new_machine,uVar8);
        goto LAB_0029e239;
      }
      if (wVar3 == L'|') {
        alternate_onto(this,&alter_machine,&cur_machine);
        cur_machine.init = -1;
        cur_machine.final = -1;
        goto LAB_0029e4a5;
      }
      if ((wVar3 == L'^') && (cur_machine.init == -1)) {
        rVar1 = RE_TEXT_BEGIN;
        goto LAB_0029d9e9;
      }
    }
  }
switchD_0029d96c_caseD_26:
  wVar3 = utf8_ptr::s_getch(local_350.p_);
  build_char(this,&new_machine,wVar3);
LAB_0029e239:
  do {
    if (1 < exprchars) {
      wVar3 = utf8_ptr::s_getch_at(local_350.p_,1);
      if ((uint)(wVar3 + L'\xffffffd6') < 2) {
LAB_0029e268:
        local_350.p_ = utf8_ptr::s_inc(local_350.p_);
        exprchars = exprchars - 1;
        uVar8 = 0;
        if (1 < exprchars) {
          wVar3 = utf8_ptr::s_getch_at(local_350.p_,1);
          uVar8 = (uint)(wVar3 == L'?');
        }
        wVar3 = utf8_ptr::s_getch(local_350.p_);
        build_closure(this,&closure_machine,&new_machine,wVar3,uVar8);
      }
      else {
        if (wVar3 != L'{') {
          if (wVar3 != L'?') goto LAB_0029e49b;
          goto LAB_0029e268;
        }
        if (pat->loop_var_cnt <= var_id) {
          pat->loop_var_cnt = var_id + 1;
        }
        pCVar6 = (CRegexParser *)utf8_ptr::s_inc(local_350.p_);
        local_350.p_ = (char *)pCVar6;
        local_350.p_ = utf8_ptr::s_inc((char *)pCVar6);
        exprchars = exprchars - 2;
        min_val = parse_int(pCVar6,&local_350,&exprchars);
        iVar5 = min_val;
        if ((exprchars != 0) && (wVar3 = utf8_ptr::s_getch(local_350.p_), wVar3 == L',')) {
          pCVar7 = (CRegexParser *)utf8_ptr::s_inc(local_350.p_);
          exprchars = exprchars - 1;
          pCVar6 = (CRegexParser *)local_350.p_;
          local_350.p_ = (char *)pCVar7;
          iVar5 = parse_int(pCVar6,&local_350,&exprchars);
        }
        while (shortest = 0, exprchars != 0) {
          wVar3 = utf8_ptr::s_getch(local_350.p_);
          if (wVar3 == L'}') {
            if ((1 < exprchars) && (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 == L'?')) {
              local_350.p_ = utf8_ptr::s_inc(local_350.p_);
              exprchars = exprchars - 1;
              shortest = 1;
            }
            break;
          }
          utf8_ptr::inc(&local_350,&exprchars);
        }
        build_interval(this,&closure_machine,&new_machine,min_val,iVar5,var_id,shortest);
      }
      new_machine = closure_machine;
      while (1 < exprchars) {
        wVar3 = utf8_ptr::s_getch_at(local_350.p_,1);
        if (((wVar3 == L'?') || (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 == L'+')) ||
           (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 == L'*')) {
          local_350.p_ = utf8_ptr::s_inc(local_350.p_);
          exprchars = exprchars - 1;
        }
        else {
          wVar3 = utf8_ptr::s_getch_at(local_350.p_,1);
          if (wVar3 != L'{') break;
          while ((1 < exprchars && (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 != L'}'))) {
            local_350.p_ = utf8_ptr::s_inc(local_350.p_);
            exprchars = exprchars - 1;
          }
        }
      }
    }
LAB_0029e49b:
    concat_onto(this,&cur_machine,&new_machine);
LAB_0029e4a5:
    if (exprchars != 0) goto code_r0x0029e4ae;
LAB_0029e165:
    if (var_id == 0) {
      dest = &alter_machine;
      alternate_onto(this,dest,&cur_machine);
      break_loops(this,dest);
      remove_branch_to_branch(this,dest);
      consolidate_strings(this,dest);
      pat->machine = alter_machine;
      pat->tuple_cnt = this->next_state_;
      if (10 < pat->group_cnt) {
        pat->group_cnt = 10;
      }
      if (pat->loop_var_cnt < 0x15) {
        return RE_STATUS_SUCCESS;
      }
      pat->loop_var_cnt = 0x14;
      return RE_STATUS_SUCCESS;
    }
LAB_0029e172:
    var_id = var_id + -1;
    iVar5 = group_stack[var_id].back_assertion;
    if (iVar5 != 0) {
      build_special(this,&new_machine,RE_LOOKBACK_POS,L'\0');
      concat_onto(this,&cur_machine,&new_machine);
    }
    alternate_onto(this,&alter_machine,&cur_machine);
    if (group_stack[var_id].capturing == 0) {
      if (group_stack[var_id].pos_assertion == 0 && group_stack[var_id].neg_assertion == 0) {
        new_machine = alter_machine;
      }
      else {
        build_assert(this,&new_machine,&alter_machine,group_stack[var_id].neg_assertion,iVar5);
      }
    }
    else {
      build_group(this,&new_machine,&alter_machine,group_stack[var_id].group_id);
    }
    cur_machine = group_stack[var_id].old_cur;
    alter_machine = group_stack[var_id].old_alter;
  } while( true );
switchD_0029d96c_caseD_28:
  if (0x14 < var_id) {
    return RE_STATUS_GROUP_NESTING_TOO_DEEP;
  }
  group_stack[var_id].old_cur = cur_machine;
  group_stack[var_id].old_alter = alter_machine;
  group_stack[var_id].group_id = pat->group_cnt;
  if ((exprchars < 3) || (wVar3 = utf8_ptr::s_getch_at(local_350.p_,1), wVar3 != L'?')) {
LAB_0029dd9c:
    group_stack[var_id].capturing = 1;
    group_stack[var_id].neg_assertion = 0;
    group_stack[var_id].pos_assertion = 0;
    group_stack[var_id].back_assertion = 0;
    pat->group_cnt = pat->group_cnt + 1;
    goto LAB_0029ddb2;
  }
  wVar3 = utf8_ptr::s_getch_at(local_350.p_,2);
  if (wVar3 == L'!') {
    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
    exprchars = exprchars - 2;
    uVar8 = 0;
    uVar9 = 1;
LAB_0029e05a:
    iVar5 = 0;
  }
  else {
    if (wVar3 == L':') {
      local_350.p_ = utf8_ptr::s_inc(local_350.p_);
      local_350.p_ = utf8_ptr::s_inc(local_350.p_);
      exprchars = exprchars - 2;
      uVar8 = 0;
      uVar9 = 0;
      goto LAB_0029e05a;
    }
    if (wVar3 == L'=') {
      local_350.p_ = utf8_ptr::s_inc(local_350.p_);
      local_350.p_ = utf8_ptr::s_inc(local_350.p_);
      exprchars = exprchars - 2;
      uVar9 = 0;
      uVar8 = 1;
      goto LAB_0029e05a;
    }
    if (((wVar3 != L'<') || (exprchars < 4)) ||
       ((wVar3 = utf8_ptr::s_getch_at(local_350.p_,3), wVar3 != L'=' &&
        (wVar3 = utf8_ptr::s_getch_at(local_350.p_,3), wVar3 != L'!')))) goto LAB_0029dd9c;
    wVar3 = utf8_ptr::s_getch_at(local_350.p_,3);
    uVar9 = (uint)(wVar3 != L'=');
    uVar8 = (uint)(wVar3 == L'=');
    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
    local_350.p_ = utf8_ptr::s_inc(local_350.p_);
    exprchars = exprchars - 3;
    iVar5 = 1;
  }
  group_stack[var_id].capturing = 0;
  group_stack[var_id].pos_assertion = uVar8;
  group_stack[var_id].neg_assertion = uVar9;
  group_stack[var_id].back_assertion = iVar5;
LAB_0029ddb2:
  cur_machine.init = -1;
  cur_machine.final = -1;
  var_id = var_id + 1;
  alter_machine.init = -1;
  alter_machine.final = -1;
  goto LAB_0029e4a5;
code_r0x0029e4ae:
  local_350.p_ = utf8_ptr::s_inc(local_350.p_);
  exprchars = exprchars - 1;
  goto LAB_0029d945;
}

Assistant:

re_status_t CRegexParser::compile(const char *expr_str, size_t exprlen,
                                  re_compiled_pattern_base *pat)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    int group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
        int capturing;
        int neg_assertion;
        int pos_assertion;
        int back_assertion;
    } group_stack[RE_GROUP_NESTING_MAX];
    utf8_ptr expr;

    /* reset everything */
    reset();

    /* we have no groups yet */
    pat->group_cnt = 0;

    /* we have no looping variables yet */
    pat->loop_var_cnt = 0;

    /* get the length of the expression in characters */
    size_t exprchars = utf8_ptr::s_len(expr_str, exprlen);

    /* 
     *   set the default match modes - maximum, first-beginning,
     *   case-sensitive 
     */
    pat->longest_match = TRUE;
    pat->first_begin = TRUE;
    pat->case_sensitive = TRUE;
    pat->case_sensitivity_specified = FALSE;

    /* start out with no current machine and no alternate machine */
    build_null_machine(&cur_machine);
    build_null_machine(&alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for (expr.set((char *)expr_str) ; exprchars != 0 ; expr.inc(), --exprchars)
    {
        switch(expr.getch())
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!is_machine_null(&cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            build_special(&new_machine, RE_TEXT_BEGIN, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, treat it as a normal character 
             */
            if (exprchars > 1
                && (expr.getch_at(1) != ')' && expr.getch_at(1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            build_special(&new_machine, RE_TEXT_END, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;
            
        case '(':
            {
                int capturing;
                int pos_assertion;
                int neg_assertion;
                int back_assertion;

                /* presume it's a capturing group */
                capturing = TRUE;

                /* presume it's not an assertion */
                pos_assertion = FALSE;
                neg_assertion = FALSE;
                back_assertion = FALSE;
                
                /* 
                 *   Add a nesting level.  Push the current machine and
                 *   alternate machines onto the group stack, and clear
                 *   everything out for the new group.  
                 */
                if (group_stack_level > RE_GROUP_NESTING_MAX)
                {
                    /* we cannot proceed - return an error */
                    return RE_STATUS_GROUP_NESTING_TOO_DEEP;
                }
                
                /* save the current state on the stack */
                group_stack[group_stack_level].old_cur = cur_machine;
                group_stack[group_stack_level].old_alter = alter_machine;
                
                /* 
                 *   Assign the group a group ID - groups are numbered in
                 *   order of their opening (left) parentheses, so we want
                 *   to assign a group number now.  We won't actually need
                 *   to know the group number until we get to the matching
                 *   close paren, but we need to assign it now, so store
                 *   it in the group stack.  
                 */
                group_stack[group_stack_level].group_id = pat->group_cnt;
                
                /* check for special group flags */
                if (exprchars > 2 && expr.getch_at(1) == '?')
                {
                    switch(expr.getch_at(2))
                    {
                    case '<':
                        /* look-back assertion */
                        if (exprchars > 3
                            && (expr.getch_at(3) == '='
                                || expr.getch_at(3) == '!'))
                        {
                            /* it's a look-back assertion */
                            back_assertion = TRUE;

                            /* assertions don't capture */
                            capturing = FALSE;

                            /* note whether it's positive or negative */
                            if (expr.getch_at(3) == '=')
                                pos_assertion = TRUE;
                            else
                                neg_assertion = TRUE;

                            /* skip the '?<=' or '?<!' part */
                            expr.inc();
                            expr.inc();
                            expr.inc();
                            exprchars -= 3;
                        }
                        break;
                        
                    case ':':
                        /* it's a non-capturing group */
                        capturing = FALSE;

                        /* skip two extra characters for the '?:' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '=':
                        /* it's a positive assertion group */
                        pos_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?=' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '!':
                        /* it's a negative assertion group */
                        neg_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?!' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    default:
                        /* it's not a recognized sequence - ignore it */
                        break;
                    }
                }

                /* remember if the group is capturing */
                group_stack[group_stack_level].capturing = capturing;

                /* remember if it's an assertion of some kind */
                group_stack[group_stack_level].pos_assertion = pos_assertion;
                group_stack[group_stack_level].neg_assertion = neg_assertion;
                group_stack[group_stack_level].back_assertion = back_assertion;
                
                /* consume the group number if it's a capturing group */
                if (capturing)
                    ++(pat->group_cnt);
                
                /* push the level */
                ++group_stack_level;
                
                /* start the new group with empty machines */
                build_null_machine(&cur_machine);
                build_null_machine(&alter_machine);
            }
            break;

        case ')':
        do_close_paren:
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   For a lookback assertion, add the lookback parent position
             *   match assertion to the group.  This ensures that we can only
             *   match the group when the match leaves us at the same
             *   position where the lookback assertion was matched.  
             */
            if (group_stack[group_stack_level].back_assertion)
            {
                build_special(&new_machine, RE_LOOKBACK_POS, 0);
                concat_onto(&cur_machine, &new_machine);
            }

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            alternate_onto(&alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.
             *   
             *   If this is a non-capturing group, don't bother building
             *   the new machine - just copy the current alternation
             *   machine onto the new machine.  
             */
            if (group_stack[group_stack_level].capturing)
            {
                /* it's a regular capturing group - add the group machine */
                build_group(&new_machine, &alter_machine,
                            group_stack[group_stack_level].group_id);
            }
            else if (group_stack[group_stack_level].pos_assertion
                     || group_stack[group_stack_level].neg_assertion)
            {
                /* it's an assertion - build the assertion group */
                build_assert(&new_machine, &alter_machine,
                             group_stack[group_stack_level].neg_assertion,
                             group_stack[group_stack_level].back_assertion);
            }
            else
            {
                /* it's a non-capturing group - just add the group tree */
                new_machine = alter_machine;
            }

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            alternate_onto(&alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            build_null_machine(&cur_machine);
            break;

        case '<':
            /* check for our various special directives */
            if ((exprchars >= 4 && memicmp(expr.getptr(), "<FE>", 4) == 0)
                || (exprchars >= 10
                    && memicmp(expr.getptr(), "<FirstEnd>", 10) == 0))
            {
                /* turn off first-begin mode */
                pat->first_begin = FALSE;
            }
            else if ((exprchars >= 4 && memicmp(expr.getptr(), "<FB>", 4) == 0)
                     || (exprchars >= 12
                         && memicmp(expr.getptr(), "<FirstBegin>", 12) == 0))
            {
                /* turn on first-begin mode */
                pat->first_begin = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Max>", 5) == 0)
            {
                /* turn on longest-match mode */
                pat->longest_match = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Min>", 5) == 0)
            {
                /* turn off longest-match mode */
                pat->longest_match = FALSE;
            }
            else if (exprchars >= 6
                     && memicmp(expr.getptr(), "<Case>", 6) == 0)
            {
                /* turn on case sensitivity */
                pat->case_sensitive = TRUE;
                pat->case_sensitivity_specified = TRUE;
            }
            else if (exprchars >= 8
                     && memicmp(expr.getptr(), "<NoCase>", 8) == 0)
            {
                /* turn off case sensitivity */
                pat->case_sensitive = FALSE;
                pat->case_sensitivity_specified = TRUE;
            }
            else
            {
                /*
                 *   It's nothing else we recognize, so it must be a
                 *   character class or class range expression, which
                 *   consists of one or more classes, single characters, or
                 *   character ranges separated by '|' delimiters.  
                 */
                if (compile_char_class_expr(&expr, &exprchars, &new_machine))
                {
                    /* success - look for postfix operators */
                    goto apply_postfix;
                }
                else
                {
                    /* 
                     *   failure - treat the whole thing as ordinary
                     *   characters 
                     */
                    goto normal_char;
                }
            }

            /* skip everything up to the closing ">" */
            while (exprchars > 0 && expr.getch() != '>')
                expr.inc(), --exprchars ;
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            expr.inc();
            --exprchars;

            /* check to see if we're at the end of the expression */
            if (exprchars == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                expr.dec();
                ++exprchars;
                break;
            }

            /* see what we have */
            switch(expr.getch())
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                build_group_matcher(&new_machine,
                                    value_of_digit(expr.getch()) - 1);

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                build_special(&new_machine, RE_WORD_BEGIN, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                build_special(&new_machine, RE_WORD_END, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                build_special(&new_machine, RE_WORD_CHAR, 0);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                build_special(&new_machine, RE_NON_WORD_CHAR, 0);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                build_special(&new_machine, RE_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                build_special(&new_machine, RE_NON_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 's':
                /* %s -> same as <space> */
                build_special(&new_machine, RE_SPACE, 0);
                goto apply_postfix;

            case 'S':
                /* %S -> same as <^space> */
                build_special(&new_machine, RE_NON_SPACE, 0);
                goto apply_postfix;

            case 'd':
                /* %d -> same as <digit> */
                build_special(&new_machine, RE_DIGIT, 0);
                goto apply_postfix;

            case 'D':
                /* %D -> same as <^digit> */
                build_special(&new_machine, RE_NON_DIGIT, 0);
                goto apply_postfix;

            case 'v':
                /* %v -> same as <vspace> */
                build_special(&new_machine, RE_VSPACE, 0);
                goto apply_postfix;

            case 'V':
                /* %V -> same as <^vspace> */
                build_special(&new_machine, RE_NON_VSPACE, 0);
                goto apply_postfix;

            default:
                /* build a new literal character recognizer */
                build_char(&new_machine, expr.getch());

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            build_special(&new_machine, RE_WILDCARD, 0);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;

                /* we have no entries yet */
                range_buf_cnt_ = 0;

                /* first, skip the open bracket */
                expr.inc();
                --exprchars;

                /* check to see if starts with the exclusion character */
                if (exprchars != 0 && expr.getch() == '^')
                {
                    /* skip the exclusion specifier */
                    expr.inc();
                    --exprchars;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == ']')
                {
                    add_range_char(']');
                    expr.inc();
                    --exprchars;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == '-')
                {
                    add_range_char('-');
                    expr.inc();
                    --exprchars;
                }

                /* scan the character set */
                while (exprchars != 0 && expr.getch() != ']')
                {
                    /* note this character */
                    wchar_t ch = expr.getch();

                    /* skip this character of the expression */
                    expr.inc();
                    --exprchars;

                    /* check for a range */
                    if (exprchars != 0 && expr.getch() == '-')
                    {
                        /* skip the '-' */
                        expr.inc();
                        --exprchars;
                        if (exprchars != 0)
                        {
                            /* get the other end of the range */
                            wchar_t ch2 = expr.getch();

                            /* skip the second character */
                            expr.inc();
                            --exprchars;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                wchar_t tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* add the range */
                            add_range_char(ch, ch2);
                        }
                    }
                    else
                    {
                        /* no range - add the one-character range */
                        add_range_char(ch);
                    }
                }

                /* create a character range machine */
                build_char_range(&new_machine, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            build_char(&new_machine, expr.getch());

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprchars > 1)
            {
                switch(expr.getch_at(1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        /* move onto the closure operator */
                        expr.inc();
                        --exprchars;

                        /* 
                         *   if the next character is '?', it's a modifier
                         *   that indicates that we are to use the
                         *   shortest match - note it if so 
                         */
                        int shortest =
                            (exprchars > 1 && expr.getch_at(1) == '?');

                        /* build the closure machine */
                        re_machine closure_machine;
                        build_closure(&closure_machine,
                                      &new_machine, expr.getch(), shortest);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                    }
                        
                    /* 
                     *   skip any redundant closure symbols, keeping only the
                     *   first one we saw 
                     */
                skip_closures:
                    while (exprchars > 1)
                    {
                        /* check for a simple closure suffix */
                        if (expr.getch_at(1) == '?'
                            || expr.getch_at(1) == '+'
                            || expr.getch_at(1) == '*')
                        {
                            /* skip it and keep looping */
                            expr.inc();
                            --exprchars;
                            continue;
                        }
                        
                        /* check for an interval */
                        if (expr.getch_at(1) == '{')
                        {
                            /* skip until we find the matching '}' */
                            while (exprchars > 1 && expr.getch_at(1) != '}')
                                expr.inc(), --exprchars;
                            
                            /* go back for anything that follows */
                            continue;
                        }
                        
                        /* if it's anything else, we're done discarding */
                        break;
                    }
                    break;

                case '{':
                    /* interval specifier */
                    {
                        int min_val;
                        int max_val;
                        re_machine interval_machine;
                        int shortest;
                        int var_id;

                        /* 
                         *   loops can never overlap, but can be nested;
                         *   so the only thing we have to worry about in
                         *   assigning a loop variable is the group
                         *   nesting depth 
                         */
                        var_id = group_stack_level;

                        /* note the highest variable ID we've seen */
                        if (var_id >= pat->loop_var_cnt)
                            pat->loop_var_cnt = var_id + 1;

                        /* presume neither min nor max will be specified */
                        min_val = -1;
                        max_val = -1;
                        
                        /* skip the current character and the '{' */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        
                        /* parse the minimum count, if provided */
                        min_val = parse_int(&expr, &exprchars);

                        /* if there's a comma, parse the maximum value */
                        if (exprchars >= 1 && expr.getch() == ',')
                        {
                            /* skip the ',' and parse the number */
                            expr.inc();
                            --exprchars;
                            max_val = parse_int(&expr, &exprchars);
                        }
                        else
                        {
                            /* 
                             *   there's no other value, so this is a
                             *   simple loop with the same value for min
                             *   and max 
                             */
                            max_val = min_val;
                        }

                        /* 
                         *   if we're not looking at a '}', skip
                         *   characters until we are 
                         */
                        while (exprchars != 0 && expr.getch() != '}')
                            expr.inc(&exprchars);

                        /* 
                         *   if there's a '?' following, it's a 'shortest'
                         *   modifier - note it 
                         */
                        shortest = FALSE;
                        if (exprchars > 1 && expr.getch_at(1) == '?')
                        {
                            /* note the modifier */
                            shortest = TRUE;

                            /* skip another character for the modifier */
                            expr.inc();
                            --exprchars;
                        }

                        /* set up an interval node */
                        build_interval(&interval_machine, &new_machine,
                                       min_val, max_val, var_id, shortest);

                        /* replace the original machine with the interval */
                        new_machine = interval_machine;

                        /* skip any closure modifiers that follow */
                        goto skip_closures;
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            concat_onto(&cur_machine, &new_machine);
            break;
        }

        /* if we've run down the expression string, go no further */
        if (exprchars == 0)
            break;
    }

    /* if there are any open parens outstanding, close them */
    if (group_stack_level != 0)
        goto do_close_paren;

    /* complete any pending alternation */
    alternate_onto(&alter_machine, &cur_machine);

    /* check for and break any infinite loops */
    break_loops(&alter_machine);

    /* remove meaningless branch-to-branch transitions */
    remove_branch_to_branch(&alter_machine);

    /* consolidate consecutive character transitions into strings */
    consolidate_strings(&alter_machine);

    /* store the results in the caller's base pattern description */
    pat->machine = alter_machine;
    pat->tuple_cnt = next_state_;

    /* limit the group count to the maximum */
    if (pat->group_cnt > RE_GROUP_REG_CNT)
        pat->group_cnt = RE_GROUP_REG_CNT;

    /* limit the variable count to the maximum */
    if (pat->loop_var_cnt > RE_LOOP_VARS_MAX)
        pat->loop_var_cnt = RE_LOOP_VARS_MAX;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}